

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMi<4>_>_>
::createLeaf(BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMi<4>_>_> *this,PrimRef *prims,
            range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  float fVar2;
  float fVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  PrimRef *pPVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  unsigned_long uVar19;
  vuint<4> geomID;
  vuint<4> primID;
  vuint<4> v1;
  vuint<4> v0;
  undefined8 local_58;
  undefined8 uStack_50;
  vuint<4> v2;
  
  uVar19 = set->_begin;
  uVar14 = (set->_end - uVar19) + 3 >> 2;
  v1.field_0.v[0] = uVar14 * 0x60;
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    primID.field_0.v[1]._0_1_ = 1;
    primID.field_0.v[0] = (longlong)this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    geomID.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&geomID);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&primID);
  }
  uVar8 = v1.field_0.v[0];
  pTVar4->bytesUsed = pTVar4->bytesUsed + v1.field_0.v[0];
  sVar12 = pTVar4->cur;
  uVar13 = (ulong)(-(int)sVar12 & 0xf);
  uVar10 = sVar12 + v1.field_0.v[0] + uVar13;
  pTVar4->cur = uVar10;
  if (pTVar4->end < uVar10) {
    pTVar4->cur = sVar12;
    uVar10 = pTVar4->allocBlockSize;
    if ((ulong)(v1.field_0.v[0] * 4) < uVar10 || v1.field_0.v[0] * 4 - uVar10 == 0) {
      geomID.field_0.v[0] = uVar10;
      pcVar11 = (char *)FastAllocator::malloc(this_00,(size_t)&geomID);
      pTVar4->ptr = pcVar11;
      sVar12 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar12;
      pTVar4->end = geomID.field_0.v[0];
      pTVar4->cur = uVar8;
      if ((ulong)geomID.field_0.v[0] < (ulong)uVar8) {
        pTVar4->cur = 0;
        geomID.field_0.v[0] = pTVar4->allocBlockSize;
        pcVar11 = (char *)FastAllocator::malloc(this_00,(size_t)&geomID);
        pTVar4->ptr = pcVar11;
        sVar12 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar12;
        pTVar4->end = geomID.field_0.v[0];
        pTVar4->cur = uVar8;
        if ((ulong)geomID.field_0.v[0] < (ulong)uVar8) {
          pTVar4->cur = 0;
          pcVar11 = (char *)0x0;
        }
        else {
          pTVar4->bytesWasted = sVar12;
        }
      }
      else {
        pTVar4->bytesWasted = sVar12;
      }
    }
    else {
      pcVar11 = (char *)FastAllocator::malloc(this_00,(size_t)&v1);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar13;
    pcVar11 = pTVar4->ptr + (uVar10 - v1.field_0._0_8_);
  }
  for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
    uVar13 = set->_end;
    pSVar5 = ((this->createLeafFunc).bvh)->scene;
    geomID.field_0.v[0] = -1;
    geomID.field_0.i[2] = 0xffffffff;
    geomID.field_0.i[3] = 0xffffffff;
    primID.field_0.v[0] = -1;
    primID.field_0.i[2] = 0xffffffff;
    primID.field_0.i[3] = 0xffffffff;
    pPVar15 = prims + uVar19;
    v0.field_0.v[0] = 0;
    v0.field_0.v[1] = 0;
    v1.field_0.v[0] = 0;
    v1.field_0.v[1] = 0;
    v2.field_0.v[0] = 0;
    v2.field_0.v[1] = 0;
    local_58 = 0;
    uStack_50 = 0;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 4) {
      if (uVar19 < uVar13) {
        fVar2 = (pPVar15->lower).field_0.m128[3];
        *(float *)((long)&geomID.field_0 + lVar16) = fVar2;
        fVar3 = (pPVar15->upper).field_0.m128[3];
        *(float *)((long)&primID.field_0 + lVar16) = fVar3;
        pGVar6 = (pSVar5->geometries).items[(uint)fVar2].ptr;
        lVar18 = (ulong)(uint)fVar3 *
                 pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        lVar7 = *(long *)&pGVar6->field_0x58;
        uVar17 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
        *(uint *)((long)&v0.field_0 + lVar16) = *(int *)(lVar7 + lVar18) * uVar17;
        *(uint *)((long)&v1.field_0 + lVar16) = *(int *)(lVar7 + 4 + lVar18) * uVar17;
        *(uint *)((long)&v2.field_0 + lVar16) = *(int *)(lVar7 + 8 + lVar18) * uVar17;
        *(uint *)((long)&local_58 + lVar16) = uVar17 * *(int *)(lVar7 + 0xc + lVar18);
        uVar19 = uVar19 + 1;
      }
      else if (lVar16 != 0) {
        *(uint *)((long)&geomID.field_0 + lVar16) = geomID.field_0.i[0];
        *(undefined4 *)((long)&primID.field_0 + lVar16) = 0xffffffff;
        uVar9 = v0.field_0.i[0];
        *(uint *)((long)&v0.field_0 + lVar16) = v0.field_0.i[0];
        *(undefined4 *)((long)&v1.field_0 + lVar16) = uVar9;
        *(undefined4 *)((long)&v2.field_0 + lVar16) = uVar9;
        *(undefined4 *)((long)&local_58 + lVar16) = uVar9;
      }
      if (uVar19 < uVar13) {
        pPVar15 = prims + uVar19;
      }
    }
    lVar16 = uVar10 * 0x60;
    *(longlong *)(pcVar11 + lVar16) = v0.field_0.v[0];
    *(longlong *)((long)(pcVar11 + lVar16) + 8) = v0.field_0.v[1];
    *(longlong *)(pcVar11 + lVar16 + 0x10) = v1.field_0.v[0];
    *(longlong *)((long)(pcVar11 + lVar16 + 0x10) + 8) = v1.field_0.v[1];
    *(longlong *)(pcVar11 + lVar16 + 0x20) = v2.field_0.v[0];
    *(longlong *)((long)(pcVar11 + lVar16 + 0x20) + 8) = v2.field_0.v[1];
    *(undefined8 *)(pcVar11 + lVar16 + 0x30) = local_58;
    *(undefined8 *)(pcVar11 + lVar16 + 0x30 + 8) = uStack_50;
    *(longlong *)(pcVar11 + lVar16 + 0x40) = geomID.field_0.v[0];
    *(longlong *)((long)(pcVar11 + lVar16 + 0x40) + 8) =
         CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]);
    *(longlong *)(pcVar11 + lVar16 + 0x50) = primID.field_0.v[0];
    *(longlong *)((long)(pcVar11 + lVar16 + 0x50) + 8) =
         CONCAT44(primID.field_0.i[3],primID.field_0.i[2]);
  }
  uVar10 = 7;
  if (uVar14 < 7) {
    uVar10 = uVar14;
  }
  return (NodeRef)(uVar10 | (ulong)pcVar11 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }